

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.cpp
# Opt level: O0

string * __thiscall
Test::Formats::to_string_abi_cxx11_(string *__return_storage_ptr__,Formats *this,char *val)

{
  Formats *local_90;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Formats *local_18;
  char *val_local;
  
  local_18 = this;
  val_local = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"\'",&local_59);
  if (local_18 == (Formats *)0x0) {
    local_90 = (Formats *)0x187355;
  }
  else {
    local_90 = local_18;
  }
  std::operator+(&local_38,&local_58,(char *)local_90);
  std::operator+(__return_storage_ptr__,&local_38,"\'");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  return __return_storage_ptr__;
}

Assistant:

std::string Formats::to_string(const char *val) { return std::string{"'"} + (val ? val : "(null)") + "'"; }